

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(char lhs,
         SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar1;
  bool bVar2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *this;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_RSI;
  char in_DIL;
  char ret;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  char *in_stack_ffffffffffffffb8;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffc0;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  u;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffe0;
  char *local_8;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)&stack0xffffffffffffffe0);
  u.m_int = in_RSI.m_int;
  bVar2 = DivisionCornerCaseHelper<unsigned_long_long,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_DIL,in_RSI,
                     (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xffffffffffffffe0);
  SVar1.m_int = in_stack_ffffffffffffffe0.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<unsigned_long_long,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
              ::DivisionCornerCase2
                        (in_DIL,in_RSI,
                         (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)&stack0xffffffffffffffe0), SVar1.m_int = in_stack_ffffffffffffffe0.m_int
     , !bVar2)) {
    this = (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffffc0);
    DivisionHelper<signed_char,unsigned_long_long,3>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((char *)in_stack_ffffffffffffffe0.m_int,(uint64_t *)u.m_int,(char *)in_RSI.m_int);
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<signed_char>(this,in_stack_ffffffffffffffb8);
    SVar1.m_int = (unsigned_long_long)local_8;
  }
  local_8 = (char *)SVar1.m_int;
  return (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )(unsigned_long_long)local_8;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}